

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.c
# Opt level: O2

service_availability_t parse_service_availability(char *value)

{
  service_availability_t sVar1;
  service_availability_t sVar2;
  
  if (*value == '0') {
    sVar2 = SA_UNAVAILABLE;
  }
  else {
    if (*value != '1') {
      return SA_NOT_SET;
    }
    sVar2 = SA_AVAILABLE;
  }
  sVar1 = SA_NOT_SET;
  if (value[1] == '\0') {
    sVar1 = sVar2;
  }
  return sVar1;
}

Assistant:

service_availability_t parse_service_availability(const char *value) {
    if (strcmp(value, "0") == 0)
        return SA_UNAVAILABLE;
    else if (strcmp(value, "1") == 0)
        return SA_AVAILABLE;
    else
        return SA_NOT_SET;
}